

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O0

Container * __thiscall
IceCore::Container::FindNext(Container *this,udword *entry,FindMode find_mode)

{
  bool bVar1;
  uint local_2c;
  udword local_20;
  FindMode local_1c;
  udword Location;
  FindMode find_mode_local;
  udword *entry_local;
  Container *this_local;
  
  local_1c = find_mode;
  _Location = entry;
  entry_local = &this->mMaxNbEntries;
  bVar1 = Contains(this,*entry,&local_20);
  if (bVar1) {
    local_20 = local_20 + 1;
    if (local_20 == this->mCurNbEntries) {
      if (local_1c == FIND_WRAP) {
        local_2c = 0;
      }
      else {
        local_2c = this->mCurNbEntries - 1;
      }
      local_20 = local_2c;
    }
    *_Location = this->mEntries[local_20];
  }
  return this;
}

Assistant:

Container& Container::FindNext(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location++;
		if(Location==mCurNbEntries)	Location = find_mode==FIND_WRAP ? 0 : mCurNbEntries-1;
		entry = mEntries[Location];
	}
	return *this;
}